

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

CTypeID lj_ctype_new(CTState *cts,CType **ctp)

{
  CType *pCVar1;
  uint uVar2;
  
  uVar2 = cts->top;
  if (cts->sizetab <= uVar2) {
    lj_ctype_new_cold_1();
  }
  cts->top = uVar2 + 1;
  pCVar1 = cts->tab + uVar2;
  *ctp = pCVar1;
  (pCVar1->name).gcptr64 = 0;
  pCVar1->info = 0;
  pCVar1->size = 0;
  pCVar1->sib = 0;
  pCVar1->next = 0;
  return uVar2;
}

Assistant:

CTypeID lj_ctype_new(CTState *cts, CType **ctp)
{
  CTypeID id = cts->top;
  CType *ct;
  lj_assertCTS(cts->L, "uninitialized cts->L");
  if (LJ_UNLIKELY(id >= cts->sizetab)) {
    if (id >= CTID_MAX) lj_err_msg(cts->L, LJ_ERR_TABOV);
#ifdef LUAJIT_CTYPE_CHECK_ANCHOR
    ct = lj_mem_newvec(cts->L, id+1, CType);
    memcpy(ct, cts->tab, id*sizeof(CType));
    memset(cts->tab, 0, id*sizeof(CType));
    lj_mem_freevec(cts->g, cts->tab, cts->sizetab, CType);
    cts->tab = ct;
    cts->sizetab = id+1;
#else
    lj_mem_growvec(cts->L, cts->tab, cts->sizetab, CTID_MAX, CType);
#endif
  }
  cts->top = id+1;
  *ctp = ct = &cts->tab[id];
  ct->info = 0;
  ct->size = 0;
  ct->sib = 0;
  ct->next = 0;
  setgcrefnull(ct->name);
  return id;
}